

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_metric.hpp
# Opt level: O2

void ylt::metric::detail::stat_metric(void)

{
  element_type *this;
  int iVar1;
  long value;
  string *psVar2;
  allocator<char> local_31;
  string local_30 [32];
  
  if (stat_metric()::user_metric_count == '\0') {
    iVar1 = __cxa_guard_acquire(&stat_metric()::user_metric_count);
    if (iVar1 != 0) {
      psVar2 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
      std::__cxx11::string::string<std::allocator<char>>(local_30,"ylt_user_metric_count",&local_31)
      ;
      static_metric_manager<ylt::metric::ylt_system_tag_t>::
      get_metric_static<ylt::metric::basic_static_gauge<long>>
                ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)
                 &stat_metric::user_metric_count,psVar2);
      std::__cxx11::string::~string(local_30);
      __cxa_atexit(std::
                   __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&stat_metric::user_metric_count,&__dso_handle);
      __cxa_guard_release(&stat_metric()::user_metric_count);
    }
  }
  basic_static_counter<long>::update
            (&(stat_metric::user_metric_count.
               super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super_basic_static_counter<long>,
             (long)metric_t::g_user_metric_count.super___atomic_base<long>._M_i);
  if (stat_metric()::user_metric_label_count == '\0') {
    iVar1 = __cxa_guard_acquire(&stat_metric()::user_metric_label_count);
    if (iVar1 != 0) {
      psVar2 = (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
      std::__cxx11::string::string<std::allocator<char>>
                (local_30,"ylt_user_metric_labels",&local_31);
      static_metric_manager<ylt::metric::ylt_system_tag_t>::
      get_metric_static<ylt::metric::basic_static_gauge<long>>
                ((static_metric_manager<ylt::metric::ylt_system_tag_t> *)
                 &stat_metric::user_metric_label_count,psVar2);
      std::__cxx11::string::~string(local_30);
      __cxa_atexit(std::
                   __shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&stat_metric::user_metric_label_count,&__dso_handle);
      __cxa_guard_release(&stat_metric()::user_metric_label_count);
    }
  }
  this = stat_metric::user_metric_label_count.
         super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
  value = thread_local_value<long>::value(dynamic_metric::g_user_metric_label_count);
  basic_static_counter<long>::update(&this->super_basic_static_counter<long>,value);
  return;
}

Assistant:

inline void stat_metric() {
  static auto user_metric_count =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_user_metric_count");
  user_metric_count->update(metric::metric_t::g_user_metric_count);

  static auto user_metric_label_count =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_user_metric_labels");
  user_metric_label_count->update(
      dynamic_metric::g_user_metric_label_count->value());
}